

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleCMakePathCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool nativePath)

{
  pointer pbVar1;
  cmMakefile *this_00;
  char *extraout_RDX;
  char *pcVar2;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  long lVar3;
  string *path_00;
  string value;
  vector<cmsys::String,_std::allocator<cmsys::String>_> path;
  string local_c0;
  string local_a0;
  string local_80;
  long local_60;
  pointer local_58;
  cmFileCommand *local_50;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar3 == 0x60) {
    local_60 = lVar3;
    local_50 = this;
    cmsys::SystemTools::SplitString(&local_48,pbVar1 + 1,':',false);
    local_58 = pbVar1[2]._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    if (local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar2 = extraout_RDX;
      path_00 = &(local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                  .super__Vector_impl_data._M_start)->super_string;
      do {
        if (path_00 !=
            &(local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
              super__Vector_impl_data._M_start)->super_string) {
          std::__cxx11::string::append((char *)&local_c0);
          pcVar2 = extraout_RDX_00;
        }
        if (nativePath) {
          cmSystemTools::ConvertToOutputPath_abi_cxx11_
                    (&local_a0,(cmSystemTools *)(path_00->_M_dataplus)._M_p,pcVar2);
          std::__cxx11::string::string((string *)&local_80,(string *)&local_a0,0,0xffffffffffffffff)
          ;
          std::__cxx11::string::operator=((string *)path_00,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (((1 < path_00->_M_string_length) &&
              (pcVar2 = (path_00->_M_dataplus)._M_p, *pcVar2 == '\"')) &&
             (pcVar2[path_00->_M_string_length - 1] == '\"')) {
            std::__cxx11::string::substr((ulong)&local_a0,(ulong)path_00);
            std::__cxx11::string::string
                      ((string *)&local_80,(string *)&local_a0,0,0xffffffffffffffff);
            std::__cxx11::string::operator=((string *)path_00,(string *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          cmsys::SystemTools::ConvertToUnixSlashes(path_00);
        }
        std::__cxx11::string::_M_append((char *)&local_c0,(ulong)(path_00->_M_dataplus)._M_p);
        path_00 = path_00 + 1;
        pcVar2 = extraout_RDX_01;
      } while (path_00 !=
               &(local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_string);
    }
    this_00 = (local_50->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&local_80,local_58,(allocator *)&local_a0);
    cmMakefile::AddDefinition(this_00,&local_80,local_c0._M_dataplus._M_p);
    lVar3 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_48);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "FILE([TO_CMAKE_PATH|TO_NATIVE_PATH] path result) must be called with exactly three arguments."
               ,"");
    cmCommand::SetError(&this->super_cmCommand,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
  }
  return lVar3 == 0x60;
}

Assistant:

bool cmFileCommand::HandleCMakePathCommand(std::vector<std::string>
                                           const& args,
                                           bool nativePath)
{
  std::vector<std::string>::const_iterator i = args.begin();
  if(args.size() != 3)
    {
    this->SetError("FILE([TO_CMAKE_PATH|TO_NATIVE_PATH] path result) must be "
      "called with exactly three arguments.");
    return false;
    }
  i++; // Get rid of subcommand
#if defined(_WIN32) && !defined(__CYGWIN__)
  char pathSep = ';';
#else
  char pathSep = ':';
#endif
  std::vector<cmsys::String> path = cmSystemTools::SplitString(*i,
                                                             pathSep);
  i++;
  const char* var =  i->c_str();
  std::string value;
  for(std::vector<cmsys::String>::iterator j = path.begin();
      j != path.end(); ++j)
    {
    if(j != path.begin())
      {
      value += ";";
      }
    if(!nativePath)
      {
      cmSystemTools::ConvertToUnixSlashes(*j);
      }
    else
      {
      *j = cmSystemTools::ConvertToOutputPath(j->c_str());
      // remove double quotes in the path
      cmsys::String& s = *j;

      if(s.size() > 1 && s[0] == '\"' && s[s.size()-1] == '\"')
        {
        s = s.substr(1,s.size()-2);
        }
      }
    value += *j;
    }
  this->Makefile->AddDefinition(var, value.c_str());
  return true;
}